

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPSession::CreateCNAME(RTPSession *this,uint8_t *buffer,size_t *bufferlength,bool resolve)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  size_t buflen2;
  char hostname [1024];
  size_t local_440;
  char local_438 [1032];
  
  *buffer = '\0';
  iVar1 = getlogin_r((char *)buffer,*bufferlength);
  if ((iVar1 != 0) || (*buffer == '\0')) {
    pcVar2 = getlogin();
    if (pcVar2 != (char *)0x0) {
      strncpy((char *)buffer,pcVar2,*bufferlength);
    }
    pcVar2 = getenv("LOGNAME");
    if (pcVar2 == (char *)0x0) {
      return -0x3b;
    }
    strncpy((char *)buffer,pcVar2,*bufferlength);
  }
  buffer[*bufferlength - 1] = '\0';
  sVar3 = strlen((char *)buffer);
  sVar5 = *bufferlength;
  if (sVar3 < sVar5 - 1) {
    buffer[sVar3] = '@';
    sVar5 = *bufferlength;
  }
  lVar4 = sVar3 + 1;
  sVar3 = sVar5 - lVar4;
  local_440 = sVar3;
  if (resolve) {
    iVar1 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])
                      (this->rtptrans,buffer + lVar4,&local_440);
    if (iVar1 < 0) {
      return iVar1;
    }
  }
  else {
    strncpy(local_438,"localhost",0x400);
    gethostname(local_438,0x400);
    strncpy((char *)(buffer + lVar4),local_438,sVar3);
    local_440 = strlen(local_438);
  }
  *bufferlength = lVar4 + local_440;
  if (0xff < lVar4 + local_440) {
    *bufferlength = 0xff;
  }
  return 0;
}

Assistant:

int RTPSession::CreateCNAME(uint8_t *buffer,size_t *bufferlength,bool resolve)
{
#ifndef WIN32
	bool gotlogin = true;
#ifdef RTP_SUPPORT_GETLOGINR
	buffer[0] = 0;
	if (getlogin_r((char *)buffer,*bufferlength) != 0)
		gotlogin = false;
	else
	{
		if (buffer[0] == 0)
			gotlogin = false;
	}
	
	if (!gotlogin) // try regular getlogin
	{
		char *loginname = getlogin();
		if (loginname == 0)
			gotlogin = false;
		else
			strncpy((char *)buffer,loginname,*bufferlength);
	}
#else
	char *loginname = getlogin();
	if (loginname == 0)
		gotlogin = false;
	else
		strncpy((char *)buffer,loginname,*bufferlength);
#endif // RTP_SUPPORT_GETLOGINR
	if (!gotlogin)
	{
		char *logname = getenv("LOGNAME");
		if (logname == 0)
			return ERR_RTP_SESSION_CANTGETLOGINNAME;
		strncpy((char *)buffer,logname,*bufferlength);
	}
#else // Win32 version

#ifndef _WIN32_WCE
	DWORD len = *bufferlength;
	if (!GetUserName((LPTSTR)buffer,&len))
		RTP_STRNCPY((char *)buffer,"unknown",*bufferlength);
#else 
	RTP_STRNCPY((char *)buffer,"unknown",*bufferlength);
#endif // _WIN32_WCE
	
#endif // WIN32
	buffer[*bufferlength-1] = 0;

	size_t offset = strlen((const char *)buffer);
	if (offset < (*bufferlength-1))
		buffer[offset] = (uint8_t)'@';
	offset++;

	size_t buflen2 = *bufferlength-offset;
	int status;
	
	if (resolve)
	{
		if ((status = rtptrans->GetLocalHostName(buffer+offset,&buflen2)) < 0)
			return status;
		*bufferlength = buflen2+offset;
	}
	else
	{
		char hostname[1024];
		
		RTP_STRNCPY(hostname,"localhost",1024); // just in case gethostname fails

		gethostname(hostname,1024);
		RTP_STRNCPY((char *)(buffer+offset),hostname,buflen2);

		*bufferlength = offset+strlen(hostname);
	}
	if (*bufferlength > RTCP_SDES_MAXITEMLENGTH)
		*bufferlength = RTCP_SDES_MAXITEMLENGTH;
	return 0;
}